

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void mark(Object *object)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  
  if (object->marked == '\0') {
    if (object->type == OBJ_DICT) {
      if (object[1].type != OBJ_STRING) {
        uVar2 = 0;
        do {
          for (puVar3 = *(undefined8 **)(&(object[2].next)->marked + uVar2 * 8);
              puVar3 != (undefined8 *)0x0; puVar3 = (undefined8 *)puVar3[4]) {
            mark((Object *)*puVar3);
            if (*(int *)(puVar3 + 2) == 2) {
              mark((Object *)puVar3[3]);
            }
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < object[1].type);
      }
    }
    else if ((object->type == OBJ_LIST) && (object[1].next != (object_t *)0x0)) {
      lVar1 = 8;
      uVar2 = 0;
      do {
        if (*(int *)(*(long *)(object + 2) + -8 + lVar1) == 2) {
          mark(*(Object **)(*(long *)(object + 2) + lVar1));
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (uVar2 < object[1].next);
    }
    object->marked = '\x01';
    return;
  }
  return;
}

Assistant:

static void mark(Object *object) {
    if (object->marked) { return; }

    if (object->type == OBJ_DICT) {
        ObjDict *dict = (ObjDict *) object;

        for (int i = 0; i < dict->content.cap; ++i) {
            HTItem *current = dict->content.buckets[i];

            while (current) {
                mark((Object *) current->key.key_obj_string);

                if (current->value.type == OBJECT) {
                    mark(current->value.o_value);
                }

                current = current->next;
            }
        }

    } else if (object->type == OBJ_LIST) {
        ObjList *list = (ObjList *) object;

        for (int i = 0; i < list->content.count; ++i) {
            CrispyValue *current = &list->content.values[i];

            if (current->type == OBJECT) {
                mark(current->o_value);
            }
        }
    }

    object->marked = 1;
}